

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMaterialRefNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false> _Var1;
  DeadlyImportError *this_00;
  unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matRefNames;
  
  if (this->m_currentNode != (aiNode *)0x0) {
    matRefNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    matRefNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    matRefNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getRefNames(node,&matRefNames);
    if (matRefNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        matRefNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var1._M_head_impl = (RefInfo *)operator_new(0x28);
      (_Var1._M_head_impl)->m_node = this->m_currentNode;
      (_Var1._M_head_impl)->m_type = MaterialRef;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&(_Var1._M_head_impl)->m_Names,&matRefNames);
      local_50._M_t.
      super___uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
      .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>,_true,_true>
            )(__uniq_ptr_data<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>,_true,_true>
              )_Var1._M_head_impl;
      std::
      vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
      ::
      emplace_back<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>
                ((vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
                  *)&this->m_unresolvedRefStack,&local_50);
      std::
      unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
      ::~unique_ptr(&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&matRefNames);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&matRefNames,"No parent node for name.",(allocator *)&local_50);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&matRefNames);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenGEXImporter::handleMaterialRefNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    std::vector<std::string> matRefNames;
    getRefNames( node, matRefNames );
    if( !matRefNames.empty() ) {
        m_unresolvedRefStack.push_back( std::unique_ptr<RefInfo>( new RefInfo( m_currentNode, RefInfo::MaterialRef, matRefNames ) ) );
    }
}